

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool BeginRead3dmLEGACYSTUFF(ON_BinaryArchive *file,uint stuff_tcode)

{
  bool bVar1;
  ON__UINT32 tcode;
  ON__INT64 big_value;
  uint local_34;
  ON__INT64 local_30;
  
  local_34 = 0;
  local_30 = 0;
  while( true ) {
    bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk(file,&local_34,&local_30);
    if (!bVar1) {
      return false;
    }
    if (local_34 == stuff_tcode) break;
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(file,false);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

static bool BeginRead3dmLEGACYSTUFF( ON_BinaryArchive& file, unsigned int stuff_tcode )
{
  // begins reading stuff chunk
  bool rc = false;
  ON__UINT32 tcode = !stuff_tcode;
  ON__INT64 big_value = 0;
  for (;;) 
  {
    if ( !file.BeginRead3dmBigChunk(&tcode,&big_value) )
      break;
    if ( tcode == stuff_tcode ) {
      rc = true;
      break;
    }
    if ( !file.EndRead3dmChunk() )
      break;
  }
  return rc;
}